

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_RadiusThrust
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int bombdistance;
  int bombdamage;
  bool bVar1;
  uint uVar2;
  VMValue *pVVar3;
  AActor *bombsource;
  AActor *pAVar4;
  bool bVar5;
  bool local_5b;
  FName local_58;
  Self local_54;
  TFlags<ActorFlag2,_unsigned_int> local_50;
  byte local_49;
  int local_48;
  uint uStack_44;
  bool sourcenothrust;
  int fullthrustdistance;
  int flags;
  int distance;
  int force;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x530,
                  "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    _distance = (AActor *)(param->field_0).field_1.a;
    local_5b = true;
    if (_distance != (AActor *)0x0) {
      local_5b = DObject::IsKindOf((DObject *)_distance,AActor::RegistrationInfo.MyClass);
    }
    if (local_5b != false) {
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x531,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        flags = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x531,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        flags = (pVVar3->field_0).i;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x532,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        fullthrustdistance = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x532,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        fullthrustdistance = (pVVar3->field_0).i;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x533,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        uStack_44 = *(uint *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x533,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        uStack_44 = (pVVar3->field_0).i;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x534,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_48 = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x534,
                        "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        local_48 = (pVVar3->field_0).i;
      }
      local_49 = 0;
      if (flags == 0) {
        flags = 0x80;
      }
      if ((fullthrustdistance < 1) && (fullthrustdistance = flags, flags < 1)) {
        fullthrustdistance = -flags;
      }
      bVar5 = false;
      if ((uStack_44 & 4) == 0) {
        bVar1 = TObjPtr<AActor>::operator!=(&_distance->target,(AActor *)0x0);
        bVar5 = false;
        if (bVar1) {
          pAVar4 = TObjPtr<AActor>::operator->(&_distance->target);
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_50,(int)pAVar4 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
          bVar5 = uVar2 != 0;
        }
      }
      if (bVar5) {
        local_49 = 1;
        operator~((EnumType)&local_54);
        pAVar4 = TObjPtr<AActor>::operator->(&_distance->target);
        TFlags<ActorFlag2,_unsigned_int>::operator&=(&pAVar4->flags2,&local_54);
      }
      pAVar4 = _distance;
      bombsource = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_distance->target);
      bombdamage = flags;
      bombdistance = fullthrustdistance;
      FName::FName(&local_58,&(_distance->DamageType).super_FName);
      P_RadiusAttack(pAVar4,bombsource,bombdamage,bombdistance,&local_58,uStack_44 | 8,local_48);
      P_CheckSplash(_distance,(double)fullthrustdistance);
      if ((local_49 & 1) != 0) {
        pAVar4 = TObjPtr<AActor>::operator->(&_distance->target);
        TFlags<ActorFlag2,_unsigned_int>::operator|=(&pAVar4->flags2,MF2_NODMGTHRUST);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x530,
                  "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x530,
                "int AF_AActor_A_RadiusThrust(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RadiusThrust)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(force);
	PARAM_INT_DEF	(distance);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(fullthrustdistance);

	bool sourcenothrust = false;

	if (force == 0) force = 128;
	if (distance <= 0) distance = abs(force);

	// Temporarily negate MF2_NODMGTHRUST on the shooter, since it renders this function useless.
	if (!(flags & RTF_NOTMISSILE) && self->target != NULL && self->target->flags2 & MF2_NODMGTHRUST)
	{
		sourcenothrust = true;
		self->target->flags2 &= ~MF2_NODMGTHRUST;
	}

	P_RadiusAttack (self, self->target, force, distance, self->DamageType, flags | RADF_NODAMAGE, fullthrustdistance);
	P_CheckSplash(self, distance);

	if (sourcenothrust)
	{
		self->target->flags2 |= MF2_NODMGTHRUST;
	}
	return 0;
}